

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::VideoTrack::set_colour_space(VideoTrack *this,char *colour_space)

{
  size_t __n;
  void *pvVar1;
  char *in_RSI;
  long in_RDI;
  size_t length;
  
  if (in_RSI != (char *)0x0) {
    if (*(void **)(in_RDI + 0xe0) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0xe0));
    }
    __n = strlen(in_RSI);
    pvVar1 = operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    *(void **)(in_RDI + 0xe0) = pvVar1;
    if (*(long *)(in_RDI + 0xe0) != 0) {
      memcpy(*(void **)(in_RDI + 0xe0),in_RSI,__n);
      *(undefined1 *)(*(long *)(in_RDI + 0xe0) + __n) = 0;
    }
  }
  return;
}

Assistant:

void VideoTrack::set_colour_space(const char* colour_space) {
  if (colour_space) {
    delete[] colour_space_;

    const size_t length = strlen(colour_space) + 1;
    colour_space_ = new (std::nothrow) char[length];  // NOLINT
    if (colour_space_) {
      memcpy(colour_space_, colour_space, length - 1);
      colour_space_[length - 1] = '\0';
    }
  }
}